

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

ptr<std::vector<ptr<log_entry>_>_> __thiscall
nuraft::inmem_log_store::log_entries_ext
          (inmem_log_store *this,ulong start,ulong end,int64 batch_size_hint_in_bytes)

{
  vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
  *this_00;
  iterator iVar1;
  buffer *this_01;
  size_t sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_R8;
  ulong uVar4;
  lock_guard<std::mutex> l;
  shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>_>
  sVar5;
  ptr<std::vector<ptr<log_entry>_>_> pVar6;
  ptr<log_entry> src;
  ulong local_70;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> local_68;
  ptr<log_entry> local_50;
  ulong local_40;
  ulong local_38;
  
  local_38 = batch_size_hint_in_bytes;
  sVar5 = std::
          make_shared<std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>
                    ();
  _Var3 = sVar5.
          super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if (-1 < in_R8) {
    local_40 = in_R8 - 1;
    uVar4 = 0;
    while (end < local_38) {
      local_68._M_ptr = (log_entry *)0x0;
      local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70 = end;
      std::mutex::lock((mutex *)&((pthread_mutex_t *)(start + 0x38))->__data);
      iVar1 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
              ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                      *)(start + 8),&local_70);
      if (iVar1._M_node == (_Base_ptr)(start + 0x10)) {
        local_50.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        iVar1 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
                        *)(start + 8),(key_type *)&local_50);
      }
      std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_68,
                 (__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *)
                 &iVar1._M_node[1]._M_parent);
      pthread_mutex_unlock((pthread_mutex_t *)(start + 0x38));
      this_00 = (vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                 *)(this->super_log_store)._vptr_log_store;
      make_clone(&local_50);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
      ::emplace_back<std::shared_ptr<nuraft::log_entry>>(this_00,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_01 = log_entry::get_buf(local_68._M_ptr);
      sVar2 = buffer::size(this_01);
      uVar4 = uVar4 + sVar2;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      _Var3._M_pi = extraout_RDX;
      if (local_40 < uVar4) break;
      end = local_70 + 1;
    }
  }
  pVar6.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  pVar6.
  super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<std::vector<ptr<log_entry>_>_>)
         pVar6.
         super___shared_ptr<std::vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<std::vector<ptr<log_entry>>>
    inmem_log_store::log_entries_ext(ulong start,
                                     ulong end,
                                     int64 batch_size_hint_in_bytes)
{
    ptr< std::vector< ptr<log_entry> > > ret =
        cs_new< std::vector< ptr<log_entry> > >();

    if (batch_size_hint_in_bytes < 0) {
        return ret;
    }

    size_t accum_size = 0;
    for (ulong ii = start ; ii < end ; ++ii) {
        ptr<log_entry> src = nullptr;
        {   std::lock_guard<std::mutex> l(logs_lock_);
            auto entry = logs_.find(ii);
            if (entry == logs_.end()) {
                entry = logs_.find(0);
                assert(0);
            }
            src = entry->second;
        }
        ret->push_back(make_clone(src));
        accum_size += src->get_buf().size();
        if (batch_size_hint_in_bytes &&
            accum_size >= (ulong)batch_size_hint_in_bytes) break;
    }
    return ret;
}